

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

int __thiscall ImFontAtlas::CustomRectRegister(ImFontAtlas *this,uint id,int width,int height)

{
  int iVar1;
  CustomRect *__dest;
  int iVar2;
  CustomRect *pCVar3;
  int iVar4;
  
  if (0xfffe < width - 1U) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x529,"int ImFontAtlas::CustomRectRegister(unsigned int, int, int)");
  }
  if (height - 1U < 0xffff) {
    iVar1 = (this->CustomRects).Size;
    if (iVar1 == (this->CustomRects).Capacity) {
      if (iVar1 == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = iVar1 / 2 + iVar1;
      }
      iVar4 = iVar1 + 1;
      if (iVar1 + 1 < iVar2) {
        iVar4 = iVar2;
      }
      __dest = (CustomRect *)ImGui::MemAlloc((long)iVar4 * 0xc);
      pCVar3 = (this->CustomRects).Data;
      if (pCVar3 == (CustomRect *)0x0) {
        pCVar3 = (CustomRect *)0x0;
      }
      else {
        memcpy(__dest,pCVar3,(long)(this->CustomRects).Size * 0xc);
        pCVar3 = (this->CustomRects).Data;
      }
      ImGui::MemFree(pCVar3);
      (this->CustomRects).Data = __dest;
      (this->CustomRects).Capacity = iVar4;
      iVar1 = (this->CustomRects).Size;
    }
    else {
      __dest = (this->CustomRects).Data;
    }
    (this->CustomRects).Size = iVar1 + 1;
    __dest[iVar1].ID = id;
    __dest[iVar1].Width = (unsigned_short)width;
    __dest[iVar1].Height = (unsigned_short)height;
    __dest[iVar1].X = 0xffff;
    __dest[iVar1].Y = 0xffff;
    return (this->CustomRects).Size + -1;
  }
  __assert_fail("height > 0 && height <= 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                ,0x52a,"int ImFontAtlas::CustomRectRegister(unsigned int, int, int)");
}

Assistant:

int ImFontAtlas::CustomRectRegister(unsigned int id, int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}